

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NamedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::NamedPortConnectionSyntax_const&>
          (BumpAllocator *this,NamedPortConnectionSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  NamedPortConnectionSyntax *pNVar7;
  long lVar8;
  Token *pTVar9;
  Token *pTVar10;
  byte bVar11;
  
  bVar11 = 0;
  pNVar7 = (NamedPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedPortConnectionSyntax *)this->endPtr < pNVar7 + 1) {
    pNVar7 = (NamedPortConnectionSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pNVar7 + 1);
  }
  (pNVar7->super_PortConnectionSyntax).super_SyntaxNode.previewNode =
       (args->super_PortConnectionSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_PortConnectionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).super_SyntaxNode.parent;
  (pNVar7->super_PortConnectionSyntax).super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar7->super_PortConnectionSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pNVar7->super_PortConnectionSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
            field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
           parent;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
       = uVar3;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar1;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
       = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
         previewNode;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pNVar7->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_PortConnectionSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pNVar7->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pNVar7->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c8770;
  pTVar9 = &args->dot;
  pTVar10 = &pNVar7->dot;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar4 = pTVar9->field_0x2;
    NVar5.raw = (pTVar9->numFlags).raw;
    uVar6 = pTVar9->rawLen;
    pTVar10->kind = pTVar9->kind;
    pTVar10->field_0x2 = uVar4;
    pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
    pTVar10->rawLen = uVar6;
    pTVar9 = (Token *)&pTVar9[-(ulong)bVar11].info;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar11].info;
  }
  return pNVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }